

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CodeGenerator::GenerateAll
          (CodeGenerator *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *files,string *parameter,GeneratorContext *generator_context,string *error)

{
  uint uVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference ppFVar4;
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  value_type local_40;
  FileDescriptor *file;
  int i;
  bool succeeded;
  string *error_local;
  GeneratorContext *generator_context_local;
  string *parameter_local;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *files_local;
  CodeGenerator *this_local;
  
  file._7_1_ = 1;
  file._0_4_ = 0;
  _i = error;
  error_local = (string *)generator_context;
  generator_context_local = (GeneratorContext *)parameter;
  parameter_local = (string *)files;
  files_local = (vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 *)this;
  do {
    uVar2 = (ulong)(int)file;
    sVar3 = std::
            vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::size((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    *)parameter_local);
    if (sVar3 <= uVar2) {
LAB_003549b2:
      return (bool)(file._7_1_ & 1);
    }
    ppFVar4 = std::
              vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ::operator[]((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                            *)parameter_local,(long)(int)file);
    local_40 = *ppFVar4;
    uVar1 = (*this->_vptr_CodeGenerator[2])(this,local_40,generator_context_local,error_local,_i);
    file._7_1_ = (byte)uVar1 & 1;
    if ((((uVar1 & 1) == 0) && (_i != (string *)0x0)) &&
       (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) != 0)) {
      std::__cxx11::string::operator=
                ((string *)_i,"Code generator returned false but provided no error description.");
    }
    if ((_i != (string *)0x0) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
      __lhs = FileDescriptor::name_abi_cxx11_(local_40);
      std::operator+(&local_80,__lhs,": ");
      std::operator+(&local_60,&local_80,_i);
      std::__cxx11::string::operator=((string *)_i,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
      goto LAB_003549b2;
    }
    if ((file._7_1_ & 1) == 0) goto LAB_003549b2;
    file._0_4_ = (int)file + 1;
  } while( true );
}

Assistant:

bool CodeGenerator::GenerateAll(
    const std::vector<const FileDescriptor*>& files,
    const string& parameter,
    GeneratorContext* generator_context,
    string* error) const {
  // Default implemenation is just to call the per file method, and prefix any
  // error string with the file to provide context.
  bool succeeded = true;
  for (int i = 0; i < files.size(); i++) {
    const FileDescriptor* file = files[i];
    succeeded = Generate(file, parameter, generator_context, error);
    if (!succeeded && error && error->empty()) {
      *error = "Code generator returned false but provided no error "
               "description.";
    }
    if (error && !error->empty()) {
      *error = file->name() + ": " + *error;
      break;
    }
    if (!succeeded) {
      break;
    }
  }
  return succeeded;
}